

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_SessionFoundHelper::RunImpl
          (initiatorFixtureLookUpSession_SessionFoundHelper *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_190;
  long local_170;
  Session *actualSession;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string header;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string delimSOH;
  initiatorFixtureLookUpSession_SessionFoundHelper *this_local;
  
  delimSOH.field_2._8_8_ = this;
  initiatorFixture::startLoggedOn(&this->super_initiatorFixture);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"\x01",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&actualSession
                 ,"8=FIX.4.2",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&actualSession
                 ,"9=100");
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_108,&local_128,"35=A");
  std::operator+(&local_e8,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_c8,&local_e8,"49=TW");
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::operator+(&local_88,&local_a8,"56=ISLD");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&actualSession);
  local_170 = FIX::Session::lookupSession((string *)local_68,false);
  bVar1 = UnitTest::Check<bool>(local_170 != 0);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_190,*ppTVar3,0xaba);
    UnitTest::TestResults::OnTestFailure(this_00,&local_190,"nullptr != actualSession");
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_SessionFound)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "9=100" + delimSOH
      + "35=A" + delimSOH
      + "49=TW" + delimSOH
      + "56=ISLD" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr != actualSession);
}